

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

int collect_reloc(BuildCtx *ctx,uint8_t *addr,int idx,int type)

{
  char *pcVar1;
  int type_local;
  int idx_local;
  uint8_t *addr_local;
  BuildCtx *ctx_local;
  
  if (199 < ctx->nreloc) {
    fprintf(_stderr,"Error: too many relocations, increase BUILD_MAX_RELOC.\n");
    exit(1);
  }
  if (relocmap[idx] < 0) {
    relocmap[idx] = ctx->nrelocsym;
    pcVar1 = sym_decorate(ctx,"",extnames[idx]);
    ctx->relocsym[ctx->nrelocsym] = pcVar1;
    ctx->nrelocsym = ctx->nrelocsym + 1;
  }
  ctx->reloc[ctx->nreloc].ofs = (int)addr - (int)ctx->code;
  ctx->reloc[ctx->nreloc].sym = relocmap[idx];
  ctx->reloc[ctx->nreloc].type = type;
  ctx->nreloc = ctx->nreloc + 1;
  return 0;
}

Assistant:

static int collect_reloc(BuildCtx *ctx, uint8_t *addr, int idx, int type)
{
  if (ctx->nreloc >= BUILD_MAX_RELOC) {
    fprintf(stderr, "Error: too many relocations, increase BUILD_MAX_RELOC.\n");
    exit(1);
  }
  if (relocmap[idx] < 0) {
    relocmap[idx] = ctx->nrelocsym;
    ctx->relocsym[ctx->nrelocsym] = sym_decorate(ctx, "", extnames[idx]);
    ctx->nrelocsym++;
  }
  ctx->reloc[ctx->nreloc].ofs = (int32_t)(addr - ctx->code);
  ctx->reloc[ctx->nreloc].sym = relocmap[idx];
  ctx->reloc[ctx->nreloc].type = type;
  ctx->nreloc++;
#if LJ_TARGET_XBOX360
  return (int)(ctx->code - addr) + 4;  /* Encode symbol offset of .text. */
#else
  return 0;  /* Encode symbol offset of 0. */
#endif
}